

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

bool ft::operator==(map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *lhs,
                   map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *rhs)

{
  bool bVar1;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_50;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_38;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_20;
  
  if ((lhs->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      .m_size ==
      (rhs->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      .m_size) {
    local_50.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_tree = &(lhs->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree;
    local_50.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_node = ((lhs->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree.m_first)->parent;
    local_50.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113cd8;
    local_38.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_node = (lhs->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
              super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              .m_tree.m_last;
    local_38.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113cd8;
    local_20.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_tree = &(rhs->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree;
    local_20.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_node = ((rhs->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree.m_first)->parent;
    local_20.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113cd8;
    local_38.
    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    .m_tree = local_50.
              super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
              .m_tree;
    bVar1 = equal<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
                      (&local_50,&local_38,&local_20,(type *)0x0,(type *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

size_type	size() const { return this->m_size; }